

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

void double_conversion::FillDigits64(uint64_t number,Vector<char> buffer,int *length)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint32_t number_00;
  int *in_R8;
  uint32_t number_01;
  
  uVar2 = (number / 10000000) % 10000000;
  number_00 = (uint32_t)(number % 10000000);
  number_01 = (uint32_t)uVar2;
  if (number < 100000000000000) {
    if (uVar2 == 0) {
      FillDigits32(number_00,buffer,(int *)0x5af3107a4000);
      return;
    }
    FillDigits32(number_01,buffer,(int *)0x5af3107a4000);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = number;
    FillDigits32(SUB164(auVar1 / ZEXT816(100000000000000),0),buffer,(int *)0x5af3107a4000);
    FillDigits32FixedLength(number_01,7,buffer,in_R8);
  }
  FillDigits32FixedLength(number_00,7,buffer,in_R8);
  return;
}

Assistant:

static void FillDigits64(uint64_t number, Vector<char> buffer, int* length) {
  const uint32_t kTen7 = 10000000;
  // For efficiency cut the number into 3 uint32_t parts, and print those.
  uint32_t part2 = static_cast<uint32_t>(number % kTen7);
  number /= kTen7;
  uint32_t part1 = static_cast<uint32_t>(number % kTen7);
  uint32_t part0 = static_cast<uint32_t>(number / kTen7);

  if (part0 != 0) {
    FillDigits32(part0, buffer, length);
    FillDigits32FixedLength(part1, 7, buffer, length);
    FillDigits32FixedLength(part2, 7, buffer, length);
  } else if (part1 != 0) {
    FillDigits32(part1, buffer, length);
    FillDigits32FixedLength(part2, 7, buffer, length);
  } else {
    FillDigits32(part2, buffer, length);
  }
}